

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_vector_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::MotionVectorTestLarge_OverallTest_Test::
~MotionVectorTestLarge_OverallTest_Test(MotionVectorTestLarge_OverallTest_Test *this)

{
  anon_unknown.dwarf_2432307::MotionVectorTestLarge::~MotionVectorTestLarge
            ((MotionVectorTestLarge *)(this + -0x18));
  operator_delete((MotionVectorTestLarge *)(this + -0x18));
  return;
}

Assistant:

TEST_P(MotionVectorTestLarge, OverallTest) {
  int width = 3840;
  int height = 2160;

  // Reduce the test clip's resolution while testing on 32-bit system.
  if (sizeof(void *) == 4) {
    width = 2048;
    height = 360;
  }

  cfg_.rc_target_bitrate = 24000;
  cfg_.g_profile = 0;
  init_flags_ = AOM_CODEC_USE_PSNR;

  std::unique_ptr<libaom_test::VideoSource> video;
  video.reset(new libaom_test::YUVVideoSource(
      "niklas_640_480_30.yuv", AOM_IMG_FMT_I420, width, height, 30, 1, 0, 3));

  ASSERT_NE(video, nullptr);
  ASSERT_NO_FATAL_FAILURE(RunLoop(video.get()));
}